

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int isshortstr(FuncState *fs,int kk)

{
  uint uVar1;
  Proto *f;
  int kk_local;
  FuncState *fs_local;
  
  if ((kk & 0x80U) == 0) {
    fs_local._4_4_ = 0;
  }
  else {
    uVar1 = kk & 0xffffff7f;
    if (((int)uVar1 < 0) || (fs->f->sizek <= (int)uVar1)) {
      __assert_fail("kk >= 0 && kk < f->sizek",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x241,"int isshortstr(FuncState *, int)");
    }
    fs_local._4_4_ = (uint)(fs->f->k[(int)uVar1].tt_ == 0x8004);
  }
  return fs_local._4_4_;
}

Assistant:

static int isshortstr(FuncState *fs, int kk) {
  if (ISK(kk)) {
    Proto *f = fs->f;
    kk = INDEXK(kk);
    lua_assert(kk >= 0 && kk < f->sizek);
    return ttisshrstring(&f->k[kk]);
  }
  return 0;
}